

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O2

string * trim(string *__return_storage_ptr__,string *s)

{
  regex e;
  
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            (&e,"^\\s+|\\s+$",0x10);
  std::
  regex_replace<std::__cxx11::regex_traits<char>,char,std::char_traits<char>,std::allocator<char>>
            (__return_storage_ptr__,s,&e,"",0);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&e);
  return __return_storage_ptr__;
}

Assistant:

std::string trim(const std::string & s) {
    std::regex e("^\\s+|\\s+$");
    return std::regex_replace(s, e, "");
}